

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::BadVulkanAllocExceptionTest_NoDeviceMemory_Test::TestBody
          (BadVulkanAllocExceptionTest_NoDeviceMemory_Test *this)

{
  undefined8 uVar1;
  AssertionResult gtest_ar;
  bad_vulkan_alloc *e;
  char *in_stack_00000040;
  int in_stack_0000004c;
  
  uVar1 = __cxa_allocate_exception(0x1b0);
  bad_vulkan_alloc::bad_vulkan_alloc((bad_vulkan_alloc *)this,in_stack_0000004c,in_stack_00000040);
  __cxa_throw(uVar1,&bad_vulkan_alloc::typeinfo,bad_vulkan_alloc::~bad_vulkan_alloc);
}

Assistant:

TEST(BadVulkanAllocExceptionTest, NoDeviceMemory) {
    try {
        throw bad_vulkan_alloc(OUT_OF_DEVICE_MEMORY, "no device memory test");
    } catch (bad_vulkan_alloc& e) {
        EXPECT_EQ(strcmp(e.what(), "Out of device memory for no device memory test."), 0);
    }
}